

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
handle_pre_init(connection<websocketpp::config::asio::transport_config> *this,init_handler *callback
               ,error_code *ec)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  size_t in_RCX;
  function<void_(const_std::error_code_&)> *this_01;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  function<void_(const_std::error_code_&)> local_68;
  function<void_(const_std::error_code_&)> local_48;
  
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,"asio connection handle pre_init",in_RCX);
  }
  if ((this->m_tcp_pre_init_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&_Stack_78,
               &(this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
    std::function<void_(std::weak_ptr<void>)>::operator()
              (&this->m_tcp_pre_init_handler,(weak_ptr<void> *)&_Stack_78);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_78._M_refcount);
  }
  if (ec->_M_value != 0) {
    std::function<void_(const_std::error_code_&)>::operator()(callback,ec);
  }
  if ((this->m_proxy)._M_string_length == 0) {
    this_01 = &local_68;
    std::function<void_(const_std::error_code_&)>::function(this_01,callback);
    post_init(this,this_01);
  }
  else {
    this_01 = &local_48;
    std::function<void_(const_std::error_code_&)>::function(this_01,callback);
    proxy_write(this,this_01);
  }
  std::_Function_base::~_Function_base(&this_01->super__Function_base);
  return;
}

Assistant:

void handle_pre_init(init_handler callback, lib::error_code const & ec) {
        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection handle pre_init");
        }

        if (m_tcp_pre_init_handler) {
            m_tcp_pre_init_handler(m_connection_hdl);
        }

        if (ec) {
            callback(ec);
        }

        // If we have a proxy set issue a proxy connect, otherwise skip to
        // post_init
        if (!m_proxy.empty()) {
            proxy_write(callback);
        } else {
            post_init(callback);
        }
    }